

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob_config.cc
# Opt level: O1

EncConfig * __thiscall QPDFJob::EncConfig::print(EncConfig *this,string *parameter)

{
  int iVar1;
  string local_38;
  
  if (((this->config->o->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
      ->keylen == 0x28) {
    iVar1 = std::__cxx11::string::compare((char *)parameter);
    ((this->config->o->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    r2_print = iVar1 == 0;
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)parameter);
    if (iVar1 == 0) {
      ((this->config->o->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
      ->r3_print = qpdf_r3p_full;
    }
    else {
      iVar1 = std::__cxx11::string::compare((char *)parameter);
      if (iVar1 == 0) {
        ((this->config->o->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr)->r3_print = qpdf_r3p_low;
      }
      else {
        iVar1 = std::__cxx11::string::compare((char *)parameter);
        if (iVar1 == 0) {
          ((this->config->o->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr)->r3_print = qpdf_r3p_none;
        }
        else {
          local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_38,"invalid print option","");
          usage(&local_38);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_38._M_dataplus._M_p != &local_38.field_2) {
            operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
          }
        }
      }
    }
  }
  return this;
}

Assistant:

QPDFJob::EncConfig*
QPDFJob::EncConfig::print(std::string const& parameter)
{
    if (config->o.m->keylen == 40) {
        config->o.m->r2_print = (parameter == "y");
    } else if (parameter == "full") {
        config->o.m->r3_print = qpdf_r3p_full;
    } else if (parameter == "low") {
        config->o.m->r3_print = qpdf_r3p_low;
    } else if (parameter == "none") {
        config->o.m->r3_print = qpdf_r3p_none;
    } else {
        usage("invalid print option");
    }
    return this;
}